

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 *pIVar1;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  int in_R8D;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  float in_stack_0000000c;
  ImVector<ImVec2> *in_stack_00000010;
  float in_stack_00000020;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  float t;
  int i_step;
  float t_step;
  ImVec2 p1;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImVector<ImVec2> *in_stack_ffffffffffffff90;
  ImVec2 local_54;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  float local_30;
  ImVec2 local_2c;
  int local_24;
  float *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  pIVar1 = ImVector<ImVec2>::back((ImVector<ImVec2> *)(in_RDI + 0x80));
  local_2c = *pIVar1;
  if (local_24 == 0) {
    PathBezierToCasteljau
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
               (float)((ulong)in_RDI >> 0x20),(float)in_RDI,(float)((ulong)in_RSI >> 0x20),
               SUB84(in_RSI,0),in_stack_00000020,(int)((ulong)in_RDX >> 0x20));
  }
  else {
    local_30 = 1.0 / (float)local_24;
    for (local_34 = 1; local_34 <= local_24; local_34 = local_34 + 1) {
      local_38 = local_30 * (float)local_34;
      local_3c = 1.0 - local_38;
      local_40 = local_3c * local_3c * local_3c;
      local_44 = local_3c * 3.0 * local_3c * local_38;
      local_48 = local_3c * 3.0 * local_38 * local_38;
      local_4c = local_38 * local_38 * local_38;
      ImVec2::ImVec2(&local_54,
                     local_4c * *local_20 +
                     local_48 * *in_RDX + local_40 * local_2c.x + local_44 * *in_RSI,
                     local_4c * local_20[1] +
                     local_48 * in_RDX[1] + local_40 * local_2c.y + local_44 * in_RSI[1]);
      ImVector<ImVec2>::push_back
                (in_stack_ffffffffffffff90,
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}